

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_audio_buffer_ref_get_cursor_in_pcm_frames
                    (ma_audio_buffer_ref *pAudioBufferRef,ma_uint64 *pCursor)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pCursor != (ma_uint64 *)0x0) && (*pCursor = 0, pAudioBufferRef != (ma_audio_buffer_ref *)0x0)
     ) {
    *pCursor = pAudioBufferRef->cursor;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_get_cursor_in_pcm_frames(const ma_audio_buffer_ref* pAudioBufferRef, ma_uint64* pCursor)
{
    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;

    if (pAudioBufferRef == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = pAudioBufferRef->cursor;

    return MA_SUCCESS;
}